

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O1

void __thiscall
flatbuffers::BinaryAnnotator::BuildTable
          (BinaryAnnotator *this,uint64_t table_offset,BinarySectionType type,Object *table)

{
  _Rb_tree_header *p_Var1;
  uint *puVar2;
  uint8_t value;
  Field *field;
  uint64_t uVar3;
  long lVar4;
  BinaryAnnotator *pBVar5;
  BinarySectionType type_00;
  __normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  _Var6;
  iterator iVar7;
  char cVar8;
  bool bVar9;
  char cVar10;
  ushort uVar11;
  undefined2 uVar12;
  uint uVar13;
  long lVar14;
  VTable *pVVar15;
  _Base_ptr p_Var16;
  long *plVar17;
  BinaryRegionType type_01;
  ulong uVar18;
  long *plVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  _Base_ptr p_Var21;
  Schema *pSVar22;
  ulong uVar23;
  ulong uVar24;
  uint64_t uVar25;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  *this_00;
  Object *pOVar26;
  ulong uVar27;
  int iVar28;
  Field *pFVar29;
  undefined8 uVar30;
  ushort uVar31;
  _Alloc_hider _Var32;
  undefined8 uVar33;
  ulong offset;
  BinaryRegionComment offset_field_comment;
  string offset_prefix;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  string enum_type;
  vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
  fields;
  BinaryRegionComment vtable_offset_comment;
  BinaryRegionType local_d2c;
  undefined1 local_d28 [8];
  _Alloc_hider local_d20;
  undefined1 local_d18 [24];
  undefined1 local_d00 [8];
  _Alloc_hider local_cf8;
  pointer local_cf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ce8;
  _Alloc_hider local_cd8;
  char *local_cd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cc8;
  size_t local_cb8;
  BinaryAnnotator *local_cb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ca8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c88;
  ulong local_c80;
  uint64_t local_c78;
  Object *local_c70;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_c68;
  uint64_t local_c50;
  allocator<char> local_c41;
  string local_c40;
  BinarySectionType local_c1c;
  __normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  local_c18;
  iterator iStack_c10;
  Entry *local_c08;
  undefined1 local_c00 [32];
  undefined8 uStack_be0;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_bd8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bc0;
  _Alloc_hider local_ba8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b98;
  _Alloc_hider local_b88;
  ios_base local_b80 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b78 [6];
  char acStack_b10 [152];
  _Base_ptr local_a78;
  ulong local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  *local_a48;
  VTable *local_a40;
  long *local_a38;
  uint local_a30;
  long local_a28 [2];
  BinaryRegionStatus local_a18;
  undefined1 *local_a10;
  long local_a08;
  undefined1 local_a00;
  undefined7 uStack_9ff;
  BinaryRegionCommentType local_9f0;
  undefined1 *local_9e8;
  long local_9e0;
  undefined1 local_9d8;
  undefined7 uStack_9d7;
  undefined1 *local_9c8;
  long local_9c0;
  undefined1 local_9b8;
  undefined7 uStack_9b7;
  size_t local_9a8;
  long *local_9a0 [2];
  long local_990 [2];
  long *local_980 [2];
  long local_970 [2];
  long *local_960 [2];
  long local_950 [2];
  long *local_940;
  uint local_938;
  long local_930 [2];
  undefined1 local_920 [8];
  _Alloc_hider local_918;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_908;
  BinaryRegionCommentType local_8f8;
  _Alloc_hider local_8f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e0;
  _Alloc_hider local_8d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8c0;
  size_t local_8b0;
  undefined1 local_8a8 [8];
  _Alloc_hider local_8a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_890;
  BinaryRegionCommentType local_880;
  _Alloc_hider local_878;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_868;
  _Alloc_hider local_858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_848;
  size_t local_838;
  undefined1 local_830 [8];
  _Alloc_hider local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_818;
  BinaryRegionCommentType local_808;
  _Alloc_hider local_800;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f0;
  _Alloc_hider local_7e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7d0;
  size_t local_7c0;
  undefined1 local_7b8 [8];
  _Alloc_hider local_7b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a0;
  BinaryRegionCommentType local_790;
  _Alloc_hider local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_778;
  _Alloc_hider local_768;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_758;
  size_t local_748;
  undefined1 local_740 [8];
  _Alloc_hider local_738;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  BinaryRegionCommentType local_718;
  _Alloc_hider local_710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_700;
  _Alloc_hider local_6f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e0;
  size_t local_6d0;
  undefined1 local_6c8 [8];
  _Alloc_hider local_6c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b0;
  BinaryRegionCommentType local_6a0;
  _Alloc_hider local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  _Alloc_hider local_678;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  size_t local_658;
  undefined1 local_650 [8];
  _Alloc_hider local_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_638;
  BinaryRegionCommentType local_628;
  _Alloc_hider local_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_610;
  _Alloc_hider local_600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f0;
  size_t local_5e0;
  undefined1 local_5d8 [8];
  _Alloc_hider local_5d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c0;
  BinaryRegionCommentType local_5b0;
  _Alloc_hider local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598;
  _Alloc_hider local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  size_t local_568;
  undefined1 local_560 [8];
  _Alloc_hider local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  BinaryRegionCommentType local_538;
  _Alloc_hider local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  _Alloc_hider local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_500;
  size_t local_4f0;
  undefined1 local_4e8 [8];
  _Alloc_hider local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  BinaryRegionCommentType local_4c0;
  _Alloc_hider local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  _Alloc_hider local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  size_t local_478;
  string local_470;
  long *local_450 [2];
  long local_440 [2];
  long *local_430 [2];
  long local_420 [2];
  long *local_410 [2];
  long local_400 [2];
  undefined1 local_3f0 [8];
  _Alloc_hider local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  BinaryRegionCommentType local_3c8;
  _Alloc_hider local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Alloc_hider local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  size_t local_380;
  undefined1 local_378 [8];
  _Alloc_hider local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  BinaryRegionCommentType local_350;
  _Alloc_hider local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  _Alloc_hider local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  size_t local_308;
  undefined1 local_300 [8];
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  BinaryRegionCommentType local_2d8;
  _Alloc_hider local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  size_t local_290;
  undefined1 local_288 [8];
  _Alloc_hider local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  BinaryRegionCommentType local_260;
  _Alloc_hider local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  size_t local_218;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_210;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  local_1f8;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  local_1c8;
  BinaryRegionComment local_198;
  BinaryRegionComment local_120;
  BinaryRegionComment local_a8;
  
  bVar9 = ContainsSection(this,table_offset);
  if (bVar9) {
    return;
  }
  local_a10 = &local_a00;
  local_a18 = OK;
  lVar14 = 0;
  local_a08 = 0;
  local_a00 = 0;
  local_9e8 = &local_9d8;
  local_9e0 = 0;
  local_9d8 = 0;
  local_9c8 = &local_9b8;
  local_9c0 = 0;
  local_9b8 = 0;
  local_9a8 = 0;
  local_9f0 = TableVTableOffset;
  uVar18 = this->binary_length_;
  if (table_offset + 3 < uVar18 && uVar18 >= 5) {
    lVar14 = (long)*(int *)(this->binary_ + table_offset);
  }
  local_cb0 = this;
  local_c70 = table;
  if (uVar18 <= table_offset + 3 || uVar18 < 5) {
    uVar25 = 0;
    if (table_offset <= uVar18) {
      uVar25 = uVar18 - table_offset;
    }
    local_410[0] = local_400;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"4","");
    local_a18 = ERROR_INCOMPLETE_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_a10);
    if (local_410[0] != local_400) {
      operator_delete(local_410[0],local_400[0] + 1);
    }
    if (*(ushort *)(local_c70 + -(long)*(int *)local_c70) < 5) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(ushort *)(local_c70 + (4 - (long)*(int *)local_c70));
    }
    uVar18 = (ulong)uVar11;
    local_ca8._M_allocated_capacity = (size_type)&local_c98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ca8,local_c70 + *(uint *)(local_c70 + uVar18) + uVar18 + 4,
               local_c70 +
               (ulong)*(uint *)(local_c70 + *(uint *)(local_c70 + uVar18) + uVar18) +
               *(uint *)(local_c70 + uVar18) + uVar18 + 4);
    local_300._0_4_ = local_a18;
    local_2f8._M_p = (pointer)&local_2e8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2f8,local_a10,local_a10 + local_a08);
    local_2d8 = local_9f0;
    local_2d0._M_p = (pointer)&local_2c0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2d0,local_9e8,local_9e8 + local_9e0);
    local_2b0._M_p = (pointer)&local_2a0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2b0,local_9c8,local_9c8 + local_9c0);
    local_290 = local_9a8;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_c00,table_offset,uVar25,Unknown,uVar25,0,
               (BinaryRegionComment *)local_300);
    anon_unknown_49::MakeSingleRegionBinarySection
              ((BinarySection *)local_d28,(string *)&local_ca8,type,(BinaryRegion *)local_c00);
    AddSection(local_cb0,table_offset,(BinarySection *)local_d28);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               local_d00);
    if (local_d28 != (undefined1  [8])local_d18) {
      operator_delete((void *)local_d28,local_d18._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b88._M_p != local_b78) {
      operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba8._M_p != &local_b98) {
      operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bd8.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
      operator_delete(local_bd8.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_bc0._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_p != &local_2a0) {
      operator_delete(local_2b0._M_p,local_2a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_p != &local_2c0) {
      operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
    }
    _Var32._M_p = local_2f8._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != &local_2e8) {
LAB_0030b9b8:
      operator_delete(_Var32._M_p,local_2e8._M_allocated_capacity + 1);
    }
  }
  else {
    uVar23 = table_offset - lVar14;
    if (uVar23 < uVar18) {
      local_c68.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c68.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c68.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_288._0_4_ = OK;
      local_c78 = table_offset;
      local_280._M_p = (pointer)&local_270;
      std::__cxx11::string::_M_construct<char*>((string *)&local_280,local_a10);
      local_260 = local_9f0;
      local_c1c = type;
      local_258._M_p = (pointer)&local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_9e8,local_9e8 + local_9e0);
      local_238._M_p = (pointer)&local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_9c8,local_9c8 + local_9c0);
      local_218 = local_9a8;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_c00,local_c78,4,SOffset,0,uVar23,
                 (BinaryRegionComment *)local_288);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b88._M_p != local_b78) {
        operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ba8._M_p != &local_b98) {
        operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd8.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
        operator_delete(local_bd8.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_bc0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_p != &local_228) {
        operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_p != &local_248) {
        operator_delete(local_258._M_p,local_248._M_allocated_capacity + 1);
      }
      uVar25 = local_c78;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_p != &local_270) {
        operator_delete(local_280._M_p,local_270._M_allocated_capacity + 1);
      }
      pVVar15 = GetOrBuildVTable(local_cb0,uVar23,local_c70,uVar25);
      if (pVVar15 != (VTable *)0x0) {
        local_a70 = pVVar15->table_size + uVar25;
        if (local_cb0->binary_length_ <= (pVVar15->table_size + uVar25) - 1) {
          local_a70 = local_cb0->binary_length_;
        }
        local_c18._M_current = (Entry *)0x0;
        iStack_c10._M_current = (Entry *)0x0;
        local_c08 = (Entry *)0x0;
        p_Var16 = (pVVar15->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(pVVar15->fields)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var16 != p_Var1) {
          do {
            if (iStack_c10._M_current == local_c08) {
              std::
              vector<flatbuffers::BinaryAnnotator::VTable::Entry,std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>>
              ::_M_realloc_insert<flatbuffers::BinaryAnnotator::VTable::Entry_const&>
                        ((vector<flatbuffers::BinaryAnnotator::VTable::Entry,std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>>
                          *)&local_c18,iStack_c10,(Entry *)&p_Var16[1]._M_parent);
            }
            else {
              p_Var21 = p_Var16[1]._M_left;
              (iStack_c10._M_current)->field = (Field *)p_Var16[1]._M_parent;
              *(_Base_ptr *)&(iStack_c10._M_current)->offset_from_table = p_Var21;
              iStack_c10._M_current = iStack_c10._M_current + 1;
            }
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          } while ((_Rb_tree_header *)p_Var16 != p_Var1);
        }
        iVar7._M_current = iStack_c10._M_current;
        _Var6._M_current = local_c18._M_current;
        if (local_c18._M_current != iStack_c10._M_current) {
          lVar14 = (long)iStack_c10._M_current - (long)local_c18._M_current >> 4;
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>,_flatbuffers::BinaryAnnotator::VTable::Entry>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>,_flatbuffers::BinaryAnnotator::VTable::Entry>
                               *)local_c00,local_c18,(lVar14 - (lVar14 + 1 >> 0x3f)) + 1 >> 1);
          if ((pointer)local_c00._16_8_ == (pointer)0x0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry*,std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::BinaryAnnotator::BuildTable(unsigned_long,flatbuffers::BinarySectionType,reflection::Object_const*)::__0>>
                      (_Var6._M_current,iVar7._M_current);
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry*,std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>>>,flatbuffers::BinaryAnnotator::VTable::Entry*,long,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::BinaryAnnotator::BuildTable(unsigned_long,flatbuffers::BinarySectionType,reflection::Object_const*)::__0>>
                      (_Var6._M_current,iVar7._M_current,local_c00._16_8_,local_c00._8_8_);
          }
          operator_delete((void *)local_c00._16_8_,local_c00._8_8_ << 4);
        }
        local_a78 = &p_Var1->_M_header;
        local_a40 = pVVar15;
        if ((long)iStack_c10._M_current - (long)local_c18._M_current != 0) {
          local_a48 = &pVVar15->fields;
          uVar18 = (long)iStack_c10._M_current - (long)local_c18._M_current >> 4;
          local_c88 = local_b78;
          uVar23 = 0;
          do {
            pBVar5 = local_cb0;
            if ((ulong)local_c18._M_current[uVar23].offset_from_table == 0) goto LAB_0030e091;
            offset = local_c18._M_current[uVar23].offset_from_table + local_c78;
            uVar27 = local_cb0->binary_length_;
            if (uVar27 <= offset) goto LAB_0030e091;
            field = local_c18._M_current[uVar23].field;
            if (field == (Field *)0x0) {
              uVar24 = local_a70;
              if (uVar23 + 1 < uVar18) {
                uVar24 = local_c18._M_current[uVar23 + 1].offset_from_table + local_c78;
              }
              uVar18 = uVar24 - offset;
              if (uVar18 == 0) goto LAB_0030e091;
              local_ca8._M_allocated_capacity = (size_type)&local_c98;
              local_ca8._8_8_ = 0;
              local_c98._M_allocated_capacity = local_c98._M_allocated_capacity & 0xffffffffffffff00
              ;
              if ((uVar18 == 4) && (offset + 3 < uVar27 && 4 < uVar27)) {
                std::__cxx11::string::append(local_ca8._M_local_buf);
                std::__cxx11::stringstream::stringstream((stringstream *)local_c00);
                *(uint *)((long)&local_bd8.
                                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                         *(long *)(local_c00._16_8_ - 0x18)) =
                     *(uint *)((long)&local_bd8.
                                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              *(long *)(local_c00._16_8_ - 0x18)) & 0xffffffb5 | 8;
                puVar2 = (uint *)((long)&local_bd8.
                                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                 *(long *)(local_c00._16_8_ - 0x18));
                *puVar2 = *puVar2 | 0x4000;
                lVar14 = *(long *)(local_c00._16_8_ - 0x18);
                if (acStack_b10[lVar14 + 1] == '\0') {
                  cVar10 = std::ios::widen((char)local_c00 + '\x10' + (char)lVar14);
                  acStack_b10[lVar14] = cVar10;
                  acStack_b10[lVar14 + 1] = '\x01';
                }
                acStack_b10[lVar14] = '0';
                *(undefined8 *)((long)&uStack_be0 + *(long *)(local_c00._16_8_ - 0x18)) = 8;
                std::ostream::_M_insert<unsigned_long>((ulong)(local_c00 + 0x10));
                std::__cxx11::stringbuf::str();
                std::__cxx11::stringstream::~stringstream((stringstream *)local_c00);
                std::ios_base::~ios_base(local_b80);
                std::__cxx11::string::_M_append(local_ca8._M_local_buf,(ulong)local_d28);
                if (local_d28 != (undefined1  [8])local_d18) {
                  operator_delete((void *)local_d28,local_d18._0_8_ + 1);
                }
                std::__cxx11::string::append(local_ca8._M_local_buf);
              }
              local_d28 = (undefined1  [8])((ulong)local_d28 & 0xffffffff00000000);
              local_d20._M_p = local_d18 + 8;
              local_d18._0_8_ = 0;
              local_d18[8] = '\0';
              local_cf8._M_p = (pointer)&local_ce8;
              local_cf0 = (pointer)0x0;
              local_ce8._M_local_buf[0] = '\0';
              local_cd8._M_p = (pointer)&local_cc8;
              local_cd0 = (char *)0x0;
              local_cc8._M_local_buf[0] = '\0';
              local_cb8 = 0;
              local_d00._0_4_ = TableUnknownField;
              uVar27 = local_cb0->binary_length_;
              if (uVar18 < uVar27 && uVar24 - 1 < uVar27) {
                std::__cxx11::string::_M_assign((string *)&local_cd8);
                local_560._0_4_ = local_d28._0_4_;
                local_558._M_p = (pointer)&local_548;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_558,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                local_538 = local_d00._0_4_;
                local_530._M_p = (pointer)&local_520;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_530,local_cf8._M_p,
                           local_cf8._M_p + (long)&local_cf0->offset);
                local_510._M_p = (pointer)&local_500;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_510,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                local_4f0 = local_cb8;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c00,offset,uVar18,Unknown,uVar18,0,
                           (BinaryRegionComment *)local_560);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b88._M_p != local_c88) {
                  operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba8._M_p != &local_b98) {
                  operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bd8.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
                  operator_delete(local_bd8.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bc0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_510._M_p != &local_500) {
                  operator_delete(local_510._M_p,local_500._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_530._M_p != &local_520) {
                  operator_delete(local_530._M_p,local_520._M_allocated_capacity + 1);
                }
                uVar30 = local_548._M_allocated_capacity;
                _Var32._M_p = local_558._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_558._M_p != &local_548) {
LAB_0030de28:
                  operator_delete(_Var32._M_p,uVar30 + 1);
                }
              }
              else {
                uVar25 = 0;
                if (offset <= uVar27) {
                  uVar25 = uVar27 - offset;
                }
                cVar10 = '\x01';
                if (9 < uVar18) {
                  uVar27 = uVar18;
                  cVar8 = '\x04';
                  do {
                    cVar10 = cVar8;
                    if (uVar27 < 100) {
                      cVar10 = cVar10 + -2;
                      goto LAB_0030dc12;
                    }
                    if (uVar27 < 1000) {
                      cVar10 = cVar10 + -1;
                      goto LAB_0030dc12;
                    }
                    if (uVar27 < 10000) goto LAB_0030dc12;
                    bVar9 = 99999 < uVar27;
                    uVar27 = uVar27 / 10000;
                    cVar8 = cVar10 + '\x04';
                  } while (bVar9);
                  cVar10 = cVar10 + '\x01';
                }
LAB_0030dc12:
                local_940 = local_930;
                std::__cxx11::string::_M_construct((ulong)&local_940,cVar10);
                std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_940,local_938,uVar18)
                ;
                local_d28._0_4_ = 0xca;
                std::__cxx11::string::_M_assign((string *)&local_d20);
                if (local_940 != local_930) {
                  operator_delete(local_940,local_930[0] + 1);
                }
                local_4e8._0_4_ = local_d28._0_4_;
                local_4e0._M_p = (pointer)&local_4d0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4e0,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                local_4c0 = local_d00._0_4_;
                local_4b8._M_p = (pointer)&local_4a8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4b8,local_cf8._M_p,
                           local_cf8._M_p + (long)&local_cf0->offset);
                local_498._M_p = (pointer)&local_488;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_498,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                local_478 = local_cb8;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c00,offset,uVar25,Unknown,uVar25,0,
                           (BinaryRegionComment *)local_4e8);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b88._M_p != local_c88) {
                  operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba8._M_p != &local_b98) {
                  operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bd8.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
                  operator_delete(local_bd8.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bc0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._M_p != &local_488) {
                  operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b8._M_p != &local_4a8) {
                  operator_delete(local_4b8._M_p,local_4a8._M_allocated_capacity + 1);
                }
                uVar30 = local_4d0._M_allocated_capacity;
                _Var32._M_p = local_4e0._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e0._M_p != &local_4d0) goto LAB_0030de28;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_cd8._M_p != &local_cc8) {
                operator_delete(local_cd8._M_p,
                                CONCAT71(local_cc8._M_allocated_capacity._1_7_,
                                         local_cc8._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_cf8._M_p != &local_ce8) {
                operator_delete(local_cf8._M_p,
                                CONCAT71(local_ce8._M_allocated_capacity._1_7_,
                                         local_ce8._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d20._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_d18 + 8)) {
                operator_delete(local_d20._M_p,CONCAT71(local_d18._9_7_,local_d18[8]) + 1);
              }
              uVar30 = local_c98._M_allocated_capacity;
              uVar33 = local_ca8._M_allocated_capacity;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ca8._M_allocated_capacity == &local_c98) goto LAB_0030e091;
              goto LAB_0030e089;
            }
            lVar14 = -(long)*(int *)field;
            uVar11 = *(ushort *)(field + -(long)*(int *)field);
            if (uVar11 < 7) {
              uVar31 = 0;
            }
            else {
              uVar31 = *(ushort *)(field + lVar14 + 6);
            }
            if (uVar31 == 0) {
              pFVar29 = (Field *)0x0;
            }
            else {
              pFVar29 = field + (ulong)*(uint *)(field + uVar31) + (ulong)uVar31;
            }
            if (*(ushort *)(pFVar29 + -(long)*(int *)pFVar29) < 5) {
              uVar31 = 0;
            }
            else {
              uVar31 = *(ushort *)(pFVar29 + (4 - (long)*(int *)pFVar29));
            }
            if ((uVar31 != 0) && ((int)(char)pFVar29[uVar31].super_Table - 1U < 0xc)) {
              if (uVar11 < 7) {
                uVar31 = 0;
              }
              else {
                uVar31 = *(ushort *)(field + lVar14 + 6);
              }
              if (uVar31 == 0) {
                pFVar29 = (Field *)0x0;
              }
              else {
                pFVar29 = field + (ulong)*(uint *)(field + uVar31) + (ulong)uVar31;
              }
              if (*(ushort *)(pFVar29 + -(long)*(int *)pFVar29) < 5) {
                uVar31 = 0;
              }
              else {
                uVar31 = *(ushort *)(pFVar29 + (4 - (long)*(int *)pFVar29));
              }
              if (uVar31 == 0) {
                uVar18 = 0;
              }
              else {
                uVar18 = (ulong)(uint)(int)(char)pFVar29[uVar31].super_Table;
              }
              if (uVar11 < 7) {
                uVar11 = 0;
              }
              else {
                uVar11 = *(ushort *)(field + lVar14 + 6);
              }
              if (uVar11 == 0) {
                pFVar29 = (Field *)0x0;
              }
              else {
                pFVar29 = field + (ulong)*(uint *)(field + uVar11) + (ulong)uVar11;
              }
              if (*(ushort *)(pFVar29 + -(long)*(int *)pFVar29) < 5) {
                uVar11 = 0;
              }
              else {
                uVar11 = *(ushort *)(pFVar29 + (4 - (long)*(int *)pFVar29));
              }
              if (uVar11 == 0) {
                uVar13 = 0xffffffff;
              }
              else {
                uVar13 = (int)(char)pFVar29[uVar11].super_Table - 1;
              }
              type_01 = Unknown;
              if (uVar13 < 0xc) {
                type_01 = *(BinaryRegionType *)(&DAT_003888cc + (ulong)uVar13 * 4);
              }
              uVar18 = (&GetTypeSize(reflection::BaseType)::sizes)[uVar18];
              local_d28 = (undefined1  [8])((ulong)(uint)local_d28._4_4_ << 0x20);
              local_d20._M_p = local_d18 + 8;
              uVar27 = 0;
              local_d18._0_8_ = 0;
              local_d18[8] = '\0';
              local_cf8._M_p = (pointer)&local_ce8;
              local_cf0 = (pointer)0x0;
              local_ce8._M_local_buf[0] = '\0';
              local_cd8._M_p = (pointer)&local_cc8;
              local_cd0 = (char *)0x0;
              local_cc8._M_local_buf[0] = '\0';
              local_cb8 = 0;
              local_d00._0_4_ = TableField;
              if (4 < *(ushort *)(field + -(long)*(int *)field)) {
                uVar27 = (ulong)*(ushort *)(field + (4 - (long)*(int *)field));
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a68,
                         (char *)(field + *(uint *)(field + uVar27) + uVar27 + 4),&local_c41);
              plVar17 = (long *)std::__cxx11::string::append((char *)&local_a68);
              local_c40._M_dataplus._M_p = (pointer)&local_c40.field_2;
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar17 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar17 == paVar20) {
                local_c40.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
                local_c40.field_2._8_8_ = plVar17[3];
              }
              else {
                local_c40.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
                local_c40._M_dataplus._M_p = (pointer)*plVar17;
              }
              local_c40._M_string_length = plVar17[1];
              *plVar17 = (long)paVar20;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              plVar17 = (long *)std::__cxx11::string::append((char *)&local_c40);
              local_ca8._M_allocated_capacity = (size_type)&local_c98;
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar17 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar17 == paVar20) {
                local_c98._M_allocated_capacity = paVar20->_M_allocated_capacity;
                local_c98._8_8_ = plVar17[3];
              }
              else {
                local_c98._M_allocated_capacity = paVar20->_M_allocated_capacity;
                local_ca8._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar17;
              }
              local_ca8._8_8_ = plVar17[1];
              *plVar17 = (long)paVar20;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              plVar17 = (long *)std::__cxx11::string::append(local_ca8._M_local_buf);
              plVar19 = plVar17 + 2;
              if ((long *)*plVar17 == plVar19) {
                local_c00._16_8_ = *plVar19;
                local_c00._24_8_ = plVar17[3];
                local_c00._0_8_ = local_c00 + 0x10;
              }
              else {
                local_c00._16_8_ = *plVar19;
                local_c00._0_8_ = (long *)*plVar17;
              }
              local_c00._8_8_ = plVar17[1];
              *plVar17 = (long)plVar19;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              std::__cxx11::string::operator=((string *)&local_cf8,(string *)local_c00);
              if ((undefined1 *)local_c00._0_8_ != local_c00 + 0x10) {
                operator_delete((void *)local_c00._0_8_,(ulong)(local_c00._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ca8._M_allocated_capacity != &local_c98) {
                operator_delete((void *)local_ca8._M_allocated_capacity,
                                local_c98._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c40._M_dataplus._M_p != &local_c40.field_2) {
                operator_delete(local_c40._M_dataplus._M_p,
                                local_c40.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
                operator_delete(local_a68._M_dataplus._M_p,
                                local_a68.field_2._M_allocated_capacity + 1);
              }
              uVar27 = pBVar5->binary_length_;
              if ((uVar18 < uVar27) && ((uVar18 + offset) - 1 < uVar27)) {
                bVar9 = IsUnionType(pBVar5,field);
                if (bVar9) {
                  if (pBVar5->binary_length_ <= offset || pBVar5->binary_length_ < 2) {
                    std::__throw_bad_optional_access();
                  }
                  bVar9 = IsValidUnionValue(pBVar5,field,pBVar5->binary_[offset]);
                  if (!bVar9) {
                    local_960[0] = local_950;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_960,"");
                    local_d28._0_4_ = 0xce;
                    std::__cxx11::string::_M_assign((string *)&local_d20);
                    if (local_960[0] != local_950) {
                      operator_delete(local_960[0],local_950[0] + 1);
                    }
                    local_650._0_4_ = local_d28._0_4_;
                    local_648._M_p = (pointer)&local_638;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_648,local_d20._M_p,local_d20._M_p + local_d18._0_8_)
                    ;
                    local_628 = local_d00._0_4_;
                    local_620._M_p = (pointer)&local_610;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_620,local_cf8._M_p,
                               local_cf8._M_p + (long)&local_cf0->offset);
                    local_600._M_p = (pointer)&local_5f0;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_600,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p)
                    ;
                    local_5e0 = local_cb8;
                    anon_unknown_49::MakeBinaryRegion
                              ((BinaryRegion *)local_c00,offset,uVar18,type_01,0,0,
                               (BinaryRegionComment *)local_650);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b88._M_p != local_c88) {
                      operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_ba8._M_p != &local_b98) {
                      operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_bd8.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
                      operator_delete(local_bd8.
                                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      local_bc0._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_600._M_p != &local_5f0) {
                      operator_delete(local_600._M_p,local_5f0._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_620._M_p != &local_610) {
                      operator_delete(local_620._M_p,local_610._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_648._M_p != &local_638) {
                      operator_delete(local_648._M_p,local_638._M_allocated_capacity + 1);
                    }
                    if (!bVar9) goto LAB_0030e03d;
                  }
                }
                local_6c8._0_4_ = local_d28._0_4_;
                local_6c0._M_p = (pointer)&local_6b0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_6c0,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                local_6a0 = local_d00._0_4_;
                local_698._M_p = (pointer)&local_688;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_698,local_cf8._M_p,
                           local_cf8._M_p + (long)&local_cf0->offset);
                local_678._M_p = (pointer)&local_668;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_678,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                local_658 = local_cb8;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c00,offset,uVar18,type_01,0,0,
                           (BinaryRegionComment *)local_6c8);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b88._M_p != local_c88) {
                  operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba8._M_p != &local_b98) {
                  operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bd8.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
                  operator_delete(local_bd8.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bc0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_678._M_p != &local_668) {
                  operator_delete(local_678._M_p,local_668._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_698._M_p != &local_688) {
                  operator_delete(local_698._M_p,local_688._M_allocated_capacity + 1);
                }
                uVar30 = local_6b0._M_allocated_capacity;
                uVar33 = local_6c0._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6c0._M_p == &local_6b0) goto LAB_0030e03d;
                goto LAB_0030e035;
              }
              uVar25 = 0;
              if (offset <= uVar27) {
                uVar25 = uVar27 - offset;
              }
              cVar10 = '\x01';
              if (9 < uVar18) {
                uVar27 = uVar18;
                cVar8 = '\x04';
                do {
                  cVar10 = cVar8;
                  if (uVar27 < 100) {
                    cVar10 = cVar10 + -2;
                    goto LAB_0030d9dc;
                  }
                  if (uVar27 < 1000) {
                    cVar10 = cVar10 + -1;
                    goto LAB_0030d9dc;
                  }
                  if (uVar27 < 10000) goto LAB_0030d9dc;
                  bVar9 = 99999 < uVar27;
                  uVar27 = uVar27 / 10000;
                  cVar8 = cVar10 + '\x04';
                } while (bVar9);
                cVar10 = cVar10 + '\x01';
              }
LAB_0030d9dc:
              local_a38 = local_a28;
              std::__cxx11::string::_M_construct((ulong)&local_a38,cVar10);
              std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a38,local_a30,uVar18);
              local_d28._0_4_ = 0xca;
              std::__cxx11::string::_M_assign((string *)&local_d20);
              if (local_a38 != local_a28) {
                operator_delete(local_a38,local_a28[0] + 1);
              }
              local_5d8._0_4_ = local_d28._0_4_;
              local_5d0._M_p = (pointer)&local_5c0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5d0,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
              local_5b0 = local_d00._0_4_;
              local_5a8._M_p = (pointer)&local_598;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5a8,local_cf8._M_p,
                         local_cf8._M_p + (long)&local_cf0->offset);
              local_588._M_p = (pointer)&local_578;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_588,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
              local_568 = local_cb8;
              anon_unknown_49::MakeBinaryRegion
                        ((BinaryRegion *)local_c00,offset,uVar25,Unknown,uVar25,0,
                         (BinaryRegionComment *)local_5d8);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b88._M_p != local_c88) {
                operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ba8._M_p != &local_b98) {
                operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bd8.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
                operator_delete(local_bd8.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                local_bc0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_p != &local_578) {
                operator_delete(local_588._M_p,local_578._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_p != &local_598) {
                operator_delete(local_5a8._M_p,local_598._M_allocated_capacity + 1);
              }
              uVar30 = local_5c0._M_allocated_capacity;
              uVar33 = local_5d0._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5d0._M_p != &local_5c0) goto LAB_0030e035;
              goto LAB_0030e03d;
            }
            if (uVar11 < 0x1f) {
              uVar11 = 0;
            }
            else {
              uVar11 = *(ushort *)(field + lVar14 + 0x1e);
            }
            if ((uVar11 == 0) || (field[uVar11].super_Table == (Table)0x0)) {
              local_c50 = 4;
              local_d2c = UOffset;
              if ((uVar27 < 5) || (uVar27 <= offset + 3)) goto LAB_0030bc2f;
              uVar18 = (ulong)*(uint *)(local_cb0->binary_ + offset);
            }
            else {
              local_c50 = 8;
              local_d2c = UOffset64;
              if ((uVar27 < 9) || (uVar27 <= offset + 7)) {
LAB_0030bc2f:
                uVar18 = 0;
              }
              else {
                uVar18 = *(ulong *)(local_cb0->binary_ + offset);
              }
            }
            local_d28 = (undefined1  [8])((ulong)(uint)local_d28._4_4_ << 0x20);
            local_d20._M_p = local_d18 + 8;
            uVar27 = 0;
            local_d18._0_8_ = 0;
            local_d18[8] = '\0';
            local_cf8._M_p = (pointer)&local_ce8;
            local_cf0 = (pointer)0x0;
            local_ce8._M_local_buf[0] = '\0';
            local_cd8._M_p = (pointer)&local_cc8;
            local_cd0 = (char *)0x0;
            local_cc8._M_local_buf[0] = '\0';
            local_cb8 = 0;
            local_d00._0_4_ = TableOffsetField;
            if (4 < *(ushort *)(field + -(long)*(int *)field)) {
              uVar27 = (ulong)*(ushort *)(field + (4 - (long)*(int *)field));
            }
            uVar13 = *(uint *)(field + uVar27);
            strlen((char *)(field + uVar13 + uVar27 + 4));
            std::__cxx11::string::_M_replace
                      ((ulong)&local_cf8,0,(char *)0x0,(ulong)(field + uVar13 + uVar27 + 4));
            pBVar5 = local_cb0;
            if (*(ushort *)(field + -(long)*(int *)field) < 5) {
              uVar11 = 0;
            }
            else {
              uVar11 = *(ushort *)(field + (4 - (long)*(int *)field));
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c40,
                       (char *)(field + (ulong)*(uint *)(field + uVar11) + (ulong)uVar11 + 4),
                       (allocator<char> *)&local_a68);
            plVar17 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_c40,0,(char *)0x0,0x388924);
            local_c00._0_8_ = local_c00 + 0x10;
            plVar19 = plVar17 + 2;
            if ((long *)*plVar17 == plVar19) {
              local_c00._16_8_ = *plVar19;
              local_c00._24_8_ = plVar17[3];
            }
            else {
              local_c00._16_8_ = *plVar19;
              local_c00._0_8_ = (long *)*plVar17;
            }
            local_c00._8_8_ = plVar17[1];
            *plVar17 = (long)plVar19;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            plVar17 = (long *)std::__cxx11::string::append(local_c00);
            local_ca8._M_allocated_capacity = (size_type)&local_c98;
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 == paVar20) {
              local_c98._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_c98._8_8_ = plVar17[3];
            }
            else {
              local_c98._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_ca8._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar17;
            }
            local_ca8._8_8_ = plVar17[1];
            *plVar17 = (long)paVar20;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            if ((undefined1 *)local_c00._0_8_ != local_c00 + 0x10) {
              operator_delete((void *)local_c00._0_8_,(ulong)(local_c00._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c40._M_dataplus._M_p != &local_c40.field_2) {
              operator_delete(local_c40._M_dataplus._M_p,local_c40.field_2._M_allocated_capacity + 1
                             );
            }
            bVar9 = IsInlineField(pBVar5,field);
            if (!bVar9) {
              if (uVar18 == 0) {
                uVar25 = 0;
                if (offset <= pBVar5->binary_length_) {
                  uVar25 = pBVar5->binary_length_ - offset;
                }
                local_450[0] = local_440;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"4","");
                local_d28._0_4_ = 0xca;
                std::__cxx11::string::_M_assign((string *)&local_d20);
                if (local_450[0] != local_440) {
                  operator_delete(local_450[0],local_440[0] + 1);
                }
                local_740._0_4_ = local_d28._0_4_;
                local_738._M_p = (pointer)&local_728;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_738,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                local_718 = local_d00._0_4_;
                local_710._M_p = (pointer)&local_700;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_710,local_cf8._M_p,
                           local_cf8._M_p + (long)&local_cf0->offset);
                local_6f0._M_p = (pointer)&local_6e0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_6f0,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                local_6d0 = local_cb8;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c00,offset,uVar25,Unknown,uVar25,0,
                           (BinaryRegionComment *)local_740);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b88._M_p != local_c88) {
                  operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba8._M_p != &local_b98) {
                  operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bd8.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
                  operator_delete(local_bd8.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bc0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6f0._M_p != &local_6e0) {
                  operator_delete(local_6f0._M_p,local_6e0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_710._M_p != &local_700) {
                  operator_delete(local_710._M_p,local_700._M_allocated_capacity + 1);
                }
                uVar30 = local_728._M_allocated_capacity;
                _Var32._M_p = local_738._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_738._M_p != &local_728) {
LAB_0030e010:
                  operator_delete(_Var32._M_p,uVar30 + 1);
                }
              }
              else {
                uVar18 = uVar18 + offset;
                if (uVar18 < pBVar5->binary_length_) goto LAB_0030be6d;
                local_980[0] = local_970;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_980,"");
                local_d28._0_4_ = 0xc9;
                std::__cxx11::string::_M_assign((string *)&local_d20);
                if (local_980[0] != local_970) {
                  operator_delete(local_980[0],local_970[0] + 1);
                }
                local_7b8._0_4_ = local_d28._0_4_;
                local_7b0._M_p = (pointer)&local_7a0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_7b0,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                local_790 = local_d00._0_4_;
                local_788._M_p = (pointer)&local_778;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_788,local_cf8._M_p,
                           local_cf8._M_p + (long)&local_cf0->offset);
                local_768._M_p = (pointer)&local_758;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_768,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                local_748 = local_cb8;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c00,offset,local_c50,local_d2c,0,uVar18,
                           (BinaryRegionComment *)local_7b8);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b88._M_p != local_c88) {
                  operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba8._M_p != &local_b98) {
                  operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bd8.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
                  operator_delete(local_bd8.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bc0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_768._M_p != &local_758) {
                  operator_delete(local_768._M_p,local_758._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_788._M_p != &local_778) {
                  operator_delete(local_788._M_p,local_778._M_allocated_capacity + 1);
                }
                uVar30 = local_7a0._M_allocated_capacity;
                _Var32._M_p = local_7b0._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7b0._M_p != &local_7a0) goto LAB_0030e010;
              }
              goto switchD_0030bef4_caseD_11;
            }
            uVar18 = 0;
LAB_0030be6d:
            lVar14 = -(long)*(int *)field;
            uVar11 = *(ushort *)(field + -(long)*(int *)field);
            if (uVar11 < 7) {
              uVar31 = 0;
            }
            else {
              uVar31 = *(ushort *)(field + lVar14 + 6);
            }
            if (uVar31 == 0) {
              pFVar29 = (Field *)0x0;
            }
            else {
              pFVar29 = field + (ulong)*(uint *)(field + uVar31) + (ulong)uVar31;
            }
            iVar28 = 0;
            uVar31 = 0;
            if (4 < *(ushort *)(pFVar29 + -(long)*(int *)pFVar29)) {
              uVar31 = *(ushort *)(pFVar29 + (4 - (long)*(int *)pFVar29));
            }
            if (uVar31 != 0) {
              iVar28 = (int)(char)pFVar29[uVar31].super_Table;
            }
            local_c80 = uVar18;
            switch(iVar28) {
            case 0xd:
              std::__cxx11::string::_M_replace((ulong)&local_cd8,0,local_cd0,0x388936);
              local_830._0_4_ = local_d28._0_4_;
              local_828._M_p = (pointer)&local_818;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_828,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
              local_808 = local_d00._0_4_;
              local_800._M_p = (pointer)&local_7f0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_800,local_cf8._M_p,
                         local_cf8._M_p + (long)&local_cf0->offset);
              local_7e0._M_p = (pointer)&local_7d0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_7e0,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
              local_7c0 = local_cb8;
              anon_unknown_49::MakeBinaryRegion
                        ((BinaryRegion *)local_c00,offset,local_c50,local_d2c,0,local_c80,
                         (BinaryRegionComment *)local_830);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b88._M_p != local_c88) {
                operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
              }
              uVar18 = local_c80;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ba8._M_p != &local_b98) {
                operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bd8.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
                operator_delete(local_bd8.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                local_bc0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7e0._M_p != &local_7d0) {
                operator_delete(local_7e0._M_p,local_7d0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_800._M_p != &local_7f0) {
                operator_delete(local_800._M_p,local_7f0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_828._M_p != &local_818) {
                operator_delete(local_828._M_p,local_818._M_allocated_capacity + 1);
              }
              BuildString(pBVar5,uVar18,local_c70,field);
              break;
            case 0xe:
              std::__cxx11::string::_M_replace((ulong)&local_cd8,0,local_cd0,0x38893f);
              local_8a8._0_4_ = local_d28._0_4_;
              local_8a0._M_p = (pointer)&local_890;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_8a0,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
              local_880 = local_d00._0_4_;
              local_878._M_p = (pointer)&local_868;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_878,local_cf8._M_p,
                         local_cf8._M_p + (long)&local_cf0->offset);
              local_858._M_p = (pointer)&local_848;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_858,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
              local_838 = local_cb8;
              anon_unknown_49::MakeBinaryRegion
                        ((BinaryRegion *)local_c00,offset,local_c50,local_d2c,0,local_c80,
                         (BinaryRegionComment *)local_8a8);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b88._M_p != local_c88) {
                operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ba8._M_p != &local_b98) {
                operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bd8.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
                operator_delete(local_bd8.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                local_bc0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_858._M_p != &local_848) {
                operator_delete(local_858._M_p,local_848._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_878._M_p != &local_868) {
                operator_delete(local_878._M_p,local_868._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_8a0._M_p != &local_890) {
                operator_delete(local_8a0._M_p,local_890._M_allocated_capacity + 1);
              }
              std::
              _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
              ::_Rb_tree(&local_1c8,&local_a48->_M_t);
              this_00 = &local_1c8;
              BuildVector(pBVar5,local_c80,local_c70,field,local_c78,
                          (map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                           *)this_00);
              goto LAB_0030ce3c;
            case 0xf:
              pSVar22 = pBVar5->schema_;
              if (*(ushort *)(pSVar22 + -(long)*(int *)pSVar22) < 5) {
                uVar31 = 0;
              }
              else {
                uVar31 = *(ushort *)(pSVar22 + (4 - (long)*(int *)pSVar22));
              }
              if (uVar31 == 0) {
                pSVar22 = (Schema *)0x0;
              }
              else {
                pSVar22 = pSVar22 + (ulong)*(uint *)(pSVar22 + uVar31) + (ulong)uVar31;
              }
              if (uVar11 < 7) {
                uVar31 = 0;
              }
              else {
                uVar31 = *(ushort *)(field + lVar14 + 6);
              }
              if (uVar31 == 0) {
                pFVar29 = (Field *)0x0;
              }
              else {
                pFVar29 = field + (ulong)*(uint *)(field + uVar31) + (ulong)uVar31;
              }
              if (*(ushort *)(pFVar29 + -(long)*(int *)pFVar29) < 9) {
                uVar31 = 0;
              }
              else {
                uVar31 = *(ushort *)(pFVar29 + (8 - (long)*(int *)pFVar29));
              }
              if (uVar31 == 0) {
                uVar13 = 0xffffffff;
              }
              else {
                uVar13 = *(uint *)(pFVar29 + uVar31);
              }
              if (*(uint *)pSVar22 <= uVar13) {
                __assert_fail("i < size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                              ,0xc1,
                              "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
                             );
              }
              lVar4 = (ulong)*(uint *)(pSVar22 + (ulong)(uVar13 << 2) + 4) + (ulong)(uVar13 << 2);
              pOVar26 = (Object *)(pSVar22 + lVar4 + 4);
              if (*(ushort *)(pOVar26 + -(long)*(int *)pOVar26) < 9) {
                uVar31 = 0;
              }
              else {
                uVar31 = *(ushort *)(pSVar22 + ((lVar4 + 0xc) - (long)*(int *)pOVar26));
              }
              if ((uVar31 == 0) || (pOVar26[uVar31].super_Table == (Table)0x0)) {
                std::__cxx11::string::operator=((string *)&local_cd8,"(table)");
                BinaryRegionComment::BinaryRegionComment(&local_a8,(BinaryRegionComment *)local_d28)
                ;
                uVar18 = local_c80;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c00,offset,local_c50,local_d2c,0,local_c80,
                           &local_a8);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
                BinaryRegion::~BinaryRegion((BinaryRegion *)local_c00);
                BinaryRegionComment::~BinaryRegionComment(&local_a8);
                BuildTable(local_cb0,uVar18,Table,pOVar26);
              }
              else {
                if (uVar11 < 5) {
                  uVar11 = 0;
                }
                else {
                  uVar11 = *(ushort *)(field + lVar14 + 4);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_470,
                           (char *)(field + (ulong)*(uint *)(field + uVar11) + (ulong)uVar11 + 4),
                           (allocator<char> *)local_c00);
                BuildStruct(local_cb0,offset,&local_c68,&local_470,pOVar26);
                uVar30 = local_470.field_2._M_allocated_capacity;
                _Var32._M_p = local_470._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_470._M_dataplus._M_p != &local_470.field_2) goto LAB_0030e010;
              }
              break;
            case 0x10:
              if (uVar11 < 9) {
                uVar11 = 0;
              }
              else {
                uVar11 = *(ushort *)(field + lVar14 + 8);
              }
              if (uVar11 == 0) {
                uVar12 = 0xffff;
              }
              else {
                uVar12 = *(short *)(field + uVar11) - _S_black;
              }
              p_Var21 = local_a78;
              for (p_Var16 = (local_a40->fields)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_parent; p_Var16 != (_Base_ptr)0x0;
                  p_Var16 = (&p_Var16->_M_left)[bVar9]) {
                bVar9 = (ushort)(short)p_Var16[1]._M_color < (ushort)uVar12;
                if (!bVar9) {
                  p_Var21 = p_Var16;
                }
              }
              p_Var16 = local_a78;
              if ((p_Var21 != local_a78) &&
                 (p_Var16 = p_Var21, (ushort)uVar12 < (ushort)(short)p_Var21[1]._M_color)) {
                p_Var16 = local_a78;
              }
              if (p_Var16 != local_a78) {
                std::__cxx11::string::operator=((string *)&local_cd8,"(union)");
                uVar27 = *(ushort *)&p_Var16[1]._M_left + local_c78;
                uVar18 = pBVar5->binary_length_;
                if (uVar27 < uVar18 && 1 < uVar18) {
                  value = pBVar5->binary_[uVar27];
                  bVar9 = IsValidUnionValue(pBVar5,field,value);
                  if (bVar9) {
                    BuildUnion_abi_cxx11_(&local_c40,pBVar5,local_c80,value,field);
                    std::operator+(&local_a68,"(union of type `",&local_c40);
                    plVar17 = (long *)std::__cxx11::string::append((char *)&local_a68);
                    plVar19 = plVar17 + 2;
                    if ((long *)*plVar17 == plVar19) {
                      local_c00._16_8_ = *plVar19;
                      local_c00._24_8_ = plVar17[3];
                      local_c00._0_8_ = local_c00 + 0x10;
                    }
                    else {
                      local_c00._16_8_ = *plVar19;
                      local_c00._0_8_ = (long *)*plVar17;
                    }
                    local_c00._8_8_ = plVar17[1];
                    *plVar17 = (long)plVar19;
                    plVar17[1] = 0;
                    *(undefined1 *)(plVar17 + 2) = 0;
                    std::__cxx11::string::operator=((string *)&local_cd8,(string *)local_c00);
                    if ((undefined1 *)local_c00._0_8_ != local_c00 + 0x10) {
                      operator_delete((void *)local_c00._0_8_,(ulong)(local_c00._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
                      operator_delete(local_a68._M_dataplus._M_p,
                                      local_a68.field_2._M_allocated_capacity + 1);
                    }
                    BinaryRegionComment::BinaryRegionComment
                              (&local_198,(BinaryRegionComment *)local_d28);
                    anon_unknown_49::MakeBinaryRegion
                              ((BinaryRegion *)local_c00,offset,local_c50,local_d2c,0,local_c80,
                               &local_198);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
                    BinaryRegion::~BinaryRegion((BinaryRegion *)local_c00);
                    BinaryRegionComment::~BinaryRegionComment(&local_198);
                    uVar30 = local_c40.field_2._M_allocated_capacity;
                    _Var32._M_p = local_c40._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c40._M_dataplus._M_p != &local_c40.field_2) goto LAB_0030e010;
                  }
                }
                else {
                  uVar25 = 0;
                  if (uVar27 <= uVar18) {
                    uVar25 = uVar18 - uVar27;
                  }
                  local_9a0[0] = local_990;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"1","");
                  local_d28._0_4_ = 0xca;
                  std::__cxx11::string::_M_assign((string *)&local_d20);
                  if (local_9a0[0] != local_990) {
                    operator_delete(local_9a0[0],local_990[0] + 1);
                  }
                  BinaryRegionComment::BinaryRegionComment
                            (&local_120,(BinaryRegionComment *)local_d28);
                  anon_unknown_49::MakeBinaryRegion
                            ((BinaryRegion *)local_c00,uVar27,uVar25,Unknown,uVar25,0,&local_120);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
                  BinaryRegion::~BinaryRegion((BinaryRegion *)local_c00);
                  BinaryRegionComment::~BinaryRegionComment(&local_120);
                }
              }
              break;
            case 0x12:
              std::__cxx11::string::_M_replace((ulong)&local_cd8,0,local_cd0,0x388948);
              local_920._0_4_ = local_d28._0_4_;
              local_918._M_p = (pointer)&local_908;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_918,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
              local_8f8 = local_d00._0_4_;
              local_8f0._M_p = (pointer)&local_8e0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_8f0,local_cf8._M_p,
                         local_cf8._M_p + (long)&local_cf0->offset);
              local_8d0._M_p = (pointer)&local_8c0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_8d0,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
              local_8b0 = local_cb8;
              anon_unknown_49::MakeBinaryRegion
                        ((BinaryRegion *)local_c00,offset,local_c50,local_d2c,0,local_c80,
                         (BinaryRegionComment *)local_920);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b88._M_p != local_c88) {
                operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ba8._M_p != &local_b98) {
                operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bd8.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
                operator_delete(local_bd8.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                local_bc0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_8d0._M_p != &local_8c0) {
                operator_delete(local_8d0._M_p,local_8c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_8f0._M_p != &local_8e0) {
                operator_delete(local_8f0._M_p,local_8e0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_918._M_p != &local_908) {
                operator_delete(local_918._M_p,local_908._M_allocated_capacity + 1);
              }
              std::
              _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
              ::_Rb_tree(&local_1f8,&local_a48->_M_t);
              this_00 = &local_1f8;
              BuildVector(pBVar5,local_c80,local_c70,field,local_c78,
                          (map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                           *)this_00);
LAB_0030ce3c:
              std::
              _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
              ::~_Rb_tree(this_00);
            }
switchD_0030bef4_caseD_11:
            uVar30 = local_c98._M_allocated_capacity;
            uVar33 = local_ca8._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ca8._M_allocated_capacity != &local_c98) {
LAB_0030e035:
              operator_delete((void *)uVar33,uVar30 + 1);
            }
LAB_0030e03d:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_cd8._M_p != &local_cc8) {
              operator_delete(local_cd8._M_p,
                              CONCAT71(local_cc8._M_allocated_capacity._1_7_,
                                       local_cc8._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_cf8._M_p != &local_ce8) {
              operator_delete(local_cf8._M_p,
                              CONCAT71(local_ce8._M_allocated_capacity._1_7_,
                                       local_ce8._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d20._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_d18 + 8)) {
              uVar30 = CONCAT71(local_d18._9_7_,local_d18[8]);
              uVar33 = local_d20._M_p;
LAB_0030e089:
              operator_delete((void *)uVar33,uVar30 + 1);
            }
LAB_0030e091:
            uVar23 = uVar23 + 1;
            uVar18 = (long)iStack_c10._M_current - (long)local_c18._M_current >> 4;
          } while (uVar23 < uVar18);
        }
        uVar25 = local_c68.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].offset;
        uVar3 = local_c68.
                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].length;
        uVar18 = uVar25 + uVar3 + 1;
        bVar9 = uVar18 <= local_a70;
        local_a70 = local_a70 - uVar18;
        pOVar26 = local_c70;
        if (bVar9 && local_a70 != 0) {
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_d18 + 8);
          local_d28 = (undefined1  [8])((ulong)local_d28 & 0xffffffff00000000);
          local_d18._0_8_ = 0;
          local_d18[8] = '\0';
          local_cf0 = (pointer)0x0;
          local_ce8._M_local_buf[0] = '\0';
          local_cd0 = (char *)0x0;
          local_cc8._M_local_buf[0] = '\0';
          local_cb8 = 0;
          local_d00._0_4_ = Padding;
          local_3f0._0_4_ = OK;
          local_3e8._M_p = (pointer)&local_3d8;
          local_d20._M_p = (pointer)paVar20;
          local_cf8._M_p = (pointer)&local_ce8;
          local_cd8._M_p = (pointer)&local_cc8;
          std::__cxx11::string::_M_construct<char*>((string *)&local_3e8,paVar20,paVar20);
          local_3c8 = local_d00._0_4_;
          local_3c0._M_p = (pointer)&local_3b0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c0,local_cf8._M_p,local_cf8._M_p + (long)&local_cf0->offset);
          local_3a0._M_p = (pointer)&local_390;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3a0,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
          local_380 = local_cb8;
          anon_unknown_49::MakeBinaryRegion
                    ((BinaryRegion *)local_c00,uVar3 + uVar25,local_a70 + 1,Uint8,local_a70 + 1,0,
                     (BinaryRegionComment *)local_3f0);
          std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
          emplace_back<flatbuffers::BinaryRegion>(&local_c68,(BinaryRegion *)local_c00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b88._M_p != local_b78) {
            operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ba8._M_p != &local_b98) {
            operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_bd8.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
            operator_delete(local_bd8.
                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            local_bc0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_p != &local_390) {
            operator_delete(local_3a0._M_p,local_390._M_allocated_capacity + 1);
          }
          pOVar26 = local_c70;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_p != &local_3b0) {
            operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_p != &local_3d8) {
            operator_delete(local_3e8._M_p,local_3d8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_cd8._M_p != &local_cc8) {
            operator_delete(local_cd8._M_p,
                            CONCAT71(local_cc8._M_allocated_capacity._1_7_,local_cc8._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_cf8._M_p != &local_ce8) {
            operator_delete(local_cf8._M_p,
                            CONCAT71(local_ce8._M_allocated_capacity._1_7_,local_ce8._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d20._M_p != paVar20) {
            operator_delete(local_d20._M_p,CONCAT71(local_d18._9_7_,local_d18[8]) + 1);
          }
        }
        type_00 = local_c1c;
        uVar25 = local_c78;
        if (*(ushort *)(pOVar26 + -(long)*(int *)pOVar26) < 5) {
          uVar11 = 0;
        }
        else {
          uVar11 = *(ushort *)(pOVar26 + (4 - (long)*(int *)pOVar26));
        }
        uVar18 = (ulong)uVar11;
        local_d28 = (undefined1  [8])local_d18;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d28,pOVar26 + (ulong)*(uint *)(pOVar26 + uVar18) + 4 + uVar18,
                   pOVar26 + (ulong)*(uint *)(pOVar26 + (ulong)*(uint *)(pOVar26 + uVar18) + 4 +
                                                        uVar18 + -4) +
                             *(uint *)(pOVar26 + uVar18) + uVar18 + 4);
        local_210.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_c68.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_210.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_c68.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_210.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_c68.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_c68.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c68.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c68.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        anon_unknown_49::MakeBinarySection
                  ((BinarySection *)local_c00,(string *)local_d28,type_00,&local_210);
        AddSection(local_cb0,uVar25,(BinarySection *)local_c00);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_bd8);
        if ((undefined1 *)local_c00._0_8_ != local_c00 + 0x10) {
          operator_delete((void *)local_c00._0_8_,(ulong)(local_c00._16_8_ + 1));
        }
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_210);
        if (local_d28 != (undefined1  [8])local_d18) {
          operator_delete((void *)local_d28,local_d18._0_8_ + 1);
        }
        if (local_c18._M_current != (Entry *)0x0) {
          operator_delete(local_c18._M_current,(long)local_c08 - (long)local_c18._M_current);
        }
      }
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&local_c68);
      goto LAB_0030e44f;
    }
    local_430[0] = local_420;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"");
    local_a18 = ERROR_OFFSET_OUT_OF_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_a10);
    if (local_430[0] != local_420) {
      operator_delete(local_430[0],local_420[0] + 1);
    }
    if (*(ushort *)(local_c70 + -(long)*(int *)local_c70) < 5) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(ushort *)(local_c70 + (4 - (long)*(int *)local_c70));
    }
    uVar18 = (ulong)uVar11;
    local_ca8._M_allocated_capacity = (size_type)&local_c98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ca8,local_c70 + *(uint *)(local_c70 + uVar18) + uVar18 + 4,
               local_c70 +
               (ulong)*(uint *)(local_c70 + *(uint *)(local_c70 + uVar18) + uVar18) +
               *(uint *)(local_c70 + uVar18) + uVar18 + 4);
    local_378._0_4_ = local_a18;
    local_370._M_p = (pointer)&local_360;
    std::__cxx11::string::_M_construct<char*>((string *)&local_370,local_a10,local_a10 + local_a08);
    local_350 = local_9f0;
    local_348._M_p = (pointer)&local_338;
    std::__cxx11::string::_M_construct<char*>((string *)&local_348,local_9e8,local_9e8 + local_9e0);
    local_328._M_p = (pointer)&local_318;
    std::__cxx11::string::_M_construct<char*>((string *)&local_328,local_9c8,local_9c8 + local_9c0);
    local_308 = local_9a8;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_c00,table_offset,4,SOffset,0,uVar23,
               (BinaryRegionComment *)local_378);
    anon_unknown_49::MakeSingleRegionBinarySection
              ((BinarySection *)local_d28,(string *)&local_ca8,type,(BinaryRegion *)local_c00);
    AddSection(local_cb0,table_offset,(BinarySection *)local_d28);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               local_d00);
    if (local_d28 != (undefined1  [8])local_d18) {
      operator_delete((void *)local_d28,local_d18._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b88._M_p != local_b78) {
      operator_delete(local_b88._M_p,local_b78[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba8._M_p != &local_b98) {
      operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bd8.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish != &local_bc0) {
      operator_delete(local_bd8.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_bc0._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_p != &local_318) {
      operator_delete(local_328._M_p,local_318._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_p != &local_338) {
      operator_delete(local_348._M_p,local_338._M_allocated_capacity + 1);
    }
    local_2e8._M_allocated_capacity = local_360._M_allocated_capacity;
    _Var32._M_p = local_370._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_p != &local_360) goto LAB_0030b9b8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca8._M_allocated_capacity != &local_c98) {
    operator_delete((void *)local_ca8._M_allocated_capacity,local_c98._M_allocated_capacity + 1);
  }
LAB_0030e44f:
  if (local_9c8 != &local_9b8) {
    operator_delete(local_9c8,CONCAT71(uStack_9b7,local_9b8) + 1);
  }
  if (local_9e8 != &local_9d8) {
    operator_delete(local_9e8,CONCAT71(uStack_9d7,local_9d8) + 1);
  }
  if (local_a10 != &local_a00) {
    operator_delete(local_a10,CONCAT71(uStack_9ff,local_a00) + 1);
  }
  return;
}

Assistant:

void BinaryAnnotator::BuildTable(const uint64_t table_offset,
                                 const BinarySectionType type,
                                 const reflection::Object *const table) {
  if (ContainsSection(table_offset)) { return; }

  BinaryRegionComment vtable_offset_comment;
  vtable_offset_comment.type = BinaryRegionCommentType::TableVTableOffset;

  const auto vtable_soffset = ReadScalar<int32_t>(table_offset);

  if (!vtable_soffset.has_value()) {
    const uint64_t remaining = RemainingBytes(table_offset);
    SetError(vtable_offset_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "4");

    AddSection(
        table_offset,
        MakeSingleRegionBinarySection(
            table->name()->str(), type,
            MakeBinaryRegion(table_offset, remaining, BinaryRegionType::Unknown,
                             remaining, 0, vtable_offset_comment)));

    // If there aren't enough bytes left to read the vtable offset, there is
    // nothing we can do.
    return;
  }

  // Tables start with the vtable
  const uint64_t vtable_offset = table_offset - vtable_soffset.value();

  if (!IsValidOffset(vtable_offset)) {
    SetError(vtable_offset_comment,
             BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);

    AddSection(table_offset,
               MakeSingleRegionBinarySection(
                   table->name()->str(), type,
                   MakeBinaryRegion(table_offset, sizeof(int32_t),
                                    BinaryRegionType::SOffset, 0, vtable_offset,
                                    vtable_offset_comment)));

    // There isn't much to do with an invalid vtable offset, as we won't be able
    // to intepret the rest of the table fields.
    return;
  }

  std::vector<BinaryRegion> regions;
  regions.push_back(MakeBinaryRegion(table_offset, sizeof(int32_t),
                                     BinaryRegionType::SOffset, 0,
                                     vtable_offset, vtable_offset_comment));

  // Parse the vtable first so we know what the rest of the fields in the table
  // are.
  const VTable *const vtable =
      GetOrBuildVTable(vtable_offset, table, table_offset);

  if (vtable == nullptr) {
    // There is no valid vtable for this table, so we cannot process the rest of
    // the table entries.
    return;
  }

  // This is the size and length of this table.
  const uint16_t table_size = vtable->table_size;
  uint64_t table_end_offset = table_offset + table_size;

  if (!IsValidOffset(table_end_offset - 1)) {
    // We already validated the table size in BuildVTable, but we have to make
    // sure we don't use a bad value here.
    table_end_offset = binary_length_;
  }

  // We need to iterate over the vtable fields by their offset in the binary,
  // not by their IDs. So copy them over to another vector that we can sort on
  // the offset_from_table property.
  std::vector<VTable::Entry> fields;
  for (const auto &vtable_field : vtable->fields) {
    fields.push_back(vtable_field.second);
  }

  std::stable_sort(fields.begin(), fields.end(),
                   [](const VTable::Entry &a, const VTable::Entry &b) {
                     return a.offset_from_table < b.offset_from_table;
                   });

  // Iterate over all the fields by order of their offset.
  for (size_t i = 0; i < fields.size(); ++i) {
    const reflection::Field *field = fields[i].field;
    const uint16_t offset_from_table = fields[i].offset_from_table;

    if (offset_from_table == 0) {
      // Skip non-present fields.
      continue;
    }

    // The field offsets are relative to the start of the table.
    const uint64_t field_offset = table_offset + offset_from_table;

    if (!IsValidOffset(field_offset)) {
      // The field offset is larger than the binary, nothing we can do.
      continue;
    }

    // We have a vtable entry for a non-existant field, that means its a binary
    // generated by a newer schema than we are currently processing.
    if (field == nullptr) {
      // Calculate the length of this unknown field.
      const uint64_t unknown_field_length =
          // Check if there is another unknown field after this one.
          ((i + 1 < fields.size())
               ? table_offset + fields[i + 1].offset_from_table
               // Otherwise use the known end of the table.
               : table_end_offset) -
          field_offset;

      if (unknown_field_length == 0) { continue; }

      std::string hint;

      if (unknown_field_length == 4) {
        const auto relative_offset = ReadScalar<uint32_t>(field_offset);
        if (relative_offset.has_value()) {
          // The field is 4 in length, so it could be an offset? Provide a hint.
          hint += "<possibly an offset? Check Loc: +0x";
          hint += ToHex(field_offset + relative_offset.value());
          hint += ">";
        }
      }

      BinaryRegionComment unknown_field_comment;
      unknown_field_comment.type = BinaryRegionCommentType::TableUnknownField;

      if (!IsValidRead(field_offset, unknown_field_length)) {
        const uint64_t remaining = RemainingBytes(field_offset);

        SetError(unknown_field_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
                 std::to_string(unknown_field_length));

        regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, unknown_field_comment));
        continue;
      }

      unknown_field_comment.default_value = hint;

      regions.push_back(MakeBinaryRegion(
          field_offset, unknown_field_length, BinaryRegionType::Unknown,
          unknown_field_length, 0, unknown_field_comment));
      continue;
    }

    if (IsScalar(field->type()->base_type())) {
      // These are the raw values store in the table.
      const uint64_t type_size = GetTypeSize(field->type()->base_type());
      const BinaryRegionType region_type =
          GetRegionType(field->type()->base_type());

      BinaryRegionComment scalar_field_comment;
      scalar_field_comment.type = BinaryRegionCommentType::TableField;
      scalar_field_comment.name =
          std::string(field->name()->c_str()) + "` (" +
          reflection::EnumNameBaseType(field->type()->base_type()) + ")";

      if (!IsValidRead(field_offset, type_size)) {
        const uint64_t remaining = RemainingBytes(field_offset);
        SetError(scalar_field_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
                 std::to_string(type_size));

        regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, scalar_field_comment));
        continue;
      }

      if (IsUnionType(field)) {
        // This is a type for a union. Validate the value
        const auto enum_value = ReadScalar<uint8_t>(field_offset);

        // This should always have a value, due to the IsValidRead check above.
        if (!IsValidUnionValue(field, enum_value.value())) {
          SetError(scalar_field_comment,
                   BinaryRegionStatus::ERROR_INVALID_UNION_TYPE);

          regions.push_back(MakeBinaryRegion(field_offset, type_size,
                                             region_type, 0, 0,
                                             scalar_field_comment));
          continue;
        }
      }

      regions.push_back(MakeBinaryRegion(field_offset, type_size, region_type,
                                         0, 0, scalar_field_comment));
      continue;
    }

    // Read the offset
    uint64_t offset = 0;
    uint64_t length = sizeof(uint32_t);
    BinaryRegionType region_type = BinaryRegionType::UOffset;

    if (field->offset64()) {
      length = sizeof(uint64_t);
      region_type = BinaryRegionType::UOffset64;
      offset = ReadScalar<uint64_t>(field_offset).value_or(0);
    } else {
      offset = ReadScalar<uint32_t>(field_offset).value_or(0);
    }
    // const auto offset_from_field = ReadScalar<uint32_t>(field_offset);
    uint64_t offset_of_next_item = 0;
    BinaryRegionComment offset_field_comment;
    offset_field_comment.type = BinaryRegionCommentType::TableOffsetField;
    offset_field_comment.name = field->name()->c_str();
    const std::string offset_prefix =
        "offset to field `" + std::string(field->name()->c_str()) + "`";

    // Validate any field that isn't inline (i.e., non-structs).
    if (!IsInlineField(field)) {
      if (offset == 0) {
        const uint64_t remaining = RemainingBytes(field_offset);

        SetError(offset_field_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

        regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, offset_field_comment));
        continue;
      }

      offset_of_next_item = field_offset + offset;

      if (!IsValidOffset(offset_of_next_item)) {
        SetError(offset_field_comment,
                 BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        continue;
      }
    }

    switch (field->type()->base_type()) {
      case reflection::BaseType::Obj: {
        const reflection::Object *next_object =
            schema_->objects()->Get(field->type()->index());

        if (next_object->is_struct()) {
          // Structs are stored inline.
          BuildStruct(field_offset, regions, field->name()->c_str(),
                      next_object);
        } else {
          offset_field_comment.default_value = "(table)";

          regions.push_back(MakeBinaryRegion(field_offset, length, region_type,
                                             0, offset_of_next_item,
                                             offset_field_comment));

          BuildTable(offset_of_next_item, BinarySectionType::Table,
                     next_object);
        }
      } break;

      case reflection::BaseType::String: {
        offset_field_comment.default_value = "(string)";
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        BuildString(offset_of_next_item, table, field);
      } break;

      case reflection::BaseType::Vector: {
        offset_field_comment.default_value = "(vector)";
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        BuildVector(offset_of_next_item, table, field, table_offset,
                    vtable->fields);
      } break;
      case reflection::BaseType::Vector64: {
        offset_field_comment.default_value = "(vector64)";
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        BuildVector(offset_of_next_item, table, field, table_offset,
                    vtable->fields);
      } break;

      case reflection::BaseType::Union: {
        const uint64_t union_offset = offset_of_next_item;

        // The union type field is always one less than the union itself.
        const uint16_t union_type_id = field->id() - 1;

        auto vtable_field = vtable->fields.find(union_type_id);
        if (vtable_field == vtable->fields.end()) {
          // TODO(dbaileychess): need to capture this error condition.
          break;
        }
        offset_field_comment.default_value = "(union)";

        const uint64_t type_offset =
            table_offset + vtable_field->second.offset_from_table;

        const auto realized_type = ReadScalar<uint8_t>(type_offset);
        if (!realized_type.has_value()) {
          const uint64_t remaining = RemainingBytes(type_offset);
          SetError(offset_field_comment,
                   BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "1");
          regions.push_back(MakeBinaryRegion(
              type_offset, remaining, BinaryRegionType::Unknown, remaining, 0,
              offset_field_comment));
          continue;
        }

        if (!IsValidUnionValue(field, realized_type.value())) {
          // We already export an error in the union type field, so just skip
          // building the union itself and it will default to an unreference
          // Binary section.
          continue;
        }

        const std::string enum_type =
            BuildUnion(union_offset, realized_type.value(), field);

        offset_field_comment.default_value =
            "(union of type `" + enum_type + "`)";

        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           union_offset, offset_field_comment));

      } break;

      default: break;
    }
  }

  // Handle the case where there is padding after the last known binary
  // region. Calculate where we left off towards the expected end of the
  // table.
  const uint64_t i = regions.back().offset + regions.back().length + 1;

  if (i < table_end_offset) {
    const uint64_t pad_bytes = table_end_offset - i + 1;

    BinaryRegionComment padding_comment;
    padding_comment.type = BinaryRegionCommentType::Padding;

    regions.push_back(MakeBinaryRegion(i - 1, pad_bytes * sizeof(uint8_t),
                                       BinaryRegionType::Uint8, pad_bytes, 0,
                                       padding_comment));
  }

  AddSection(table_offset,
             MakeBinarySection(table->name()->str(), type, std::move(regions)));
}